

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void xdgSurfaceHandleConfigure(void *userData,xdg_surface *surface,uint32_t serial)

{
  wl_proxy *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint32_t uVar3;
  int iVar4;
  GLFWbool GVar5;
  int height;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar9;
  undefined1 auVar8 [16];
  
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  uVar3 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)surface);
  (*p_Var2)((wl_proxy *)surface,4,(wl_interface *)0x0,uVar3,0,(ulong)serial);
  iVar4 = *(int *)((long)userData + 0x3b0);
  if ((((*(int *)((long)userData + 0x370) != iVar4) &&
       (*(int *)((long)userData + 0x370) = iVar4, p_Var2 = _glfw.wl.client.proxy_marshal_flags,
       iVar4 == 0)) && (*(long *)((long)userData + 0x50) != 0)) &&
     (*(int *)((long)userData + 0x10) != 0)) {
    pwVar1 = *(wl_proxy **)((long)userData + 0x3c0);
    uVar3 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
    (*p_Var2)(pwVar1,0xd,(wl_interface *)0x0,uVar3,0);
  }
  iVar4 = *(int *)((long)userData + 0x36c);
  iVar6 = *(int *)((long)userData + 0x3a8);
  if (iVar4 != iVar6) {
    *(int *)((long)userData + 0x36c) = iVar6;
    _glfwInputWindowMaximize((_GLFWwindow *)userData,iVar6);
    iVar4 = *(int *)((long)userData + 0x36c);
  }
  *(int *)((long)userData + 0x374) = *(int *)((long)userData + 0x3b4);
  iVar6 = *(int *)((long)userData + 0x3a0);
  height = *(int *)((long)userData + 0x3a4);
  if (((iVar4 == 0 && *(int *)((long)userData + 0x3b4) == 0) &&
      (*(int *)((long)userData + 0x78) != -1)) && (*(int *)((long)userData + 0x7c) != -1)) {
    auVar8._4_4_ = (float)*(int *)((long)userData + 0x78);
    auVar8._0_4_ = (float)iVar6;
    auVar7._0_4_ = (float)height;
    auVar7._4_4_ = (float)*(int *)((long)userData + 0x7c);
    auVar7._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8 = divps(auVar8,auVar7);
    fVar9 = auVar8._4_4_;
    if (fVar9 <= auVar8._0_4_) {
      if (fVar9 < auVar8._0_4_) {
        iVar6 = (int)(auVar7._0_4_ * fVar9);
      }
    }
    else {
      height = (int)((float)iVar6 / fVar9);
    }
  }
  GVar5 = resizeWindow((_GLFWwindow *)userData,iVar6,height);
  if (GVar5 != 0) {
    _glfwInputWindowSize
              ((_GLFWwindow *)userData,*(int *)((long)userData + 0x358),
               *(int *)((long)userData + 0x35c));
    if (*(int *)((long)userData + 0x368) != 0) {
      _glfwInputWindowDamage((_GLFWwindow *)userData);
    }
  }
  if ((*(int *)((long)userData + 0x368) == 0) &&
     ((*(long *)((long)userData + 0x3c8) == 0 || (*(int *)((long)userData + 0x3d0) != 0)))) {
    *(undefined4 *)((long)userData + 0x368) = 1;
    _glfwInputWindowDamage((_GLFWwindow *)userData);
    return;
  }
  return;
}

Assistant:

static void xdgSurfaceHandleConfigure(void* userData,
                                      struct xdg_surface* surface,
                                      uint32_t serial)
{
    _GLFWwindow* window = userData;

    xdg_surface_ack_configure(surface, serial);

    if (window->wl.activated != window->wl.pending.activated)
    {
        window->wl.activated = window->wl.pending.activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                xdg_toplevel_set_minimized(window->wl.xdg.toplevel);
        }
    }

    if (window->wl.maximized != window->wl.pending.maximized)
    {
        window->wl.maximized = window->wl.pending.maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = window->wl.pending.fullscreen;

    int width  = window->wl.pending.width;
    int height = window->wl.pending.height;

    if (!window->wl.maximized && !window->wl.fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);

        if (window->wl.visible)
            _glfwInputWindowDamage(window);
    }

    if (!window->wl.visible)
    {
        // Allow the window to be mapped only if it either has no XDG
        // decorations or they have already received a configure event
        if (!window->wl.xdg.decoration || window->wl.xdg.decorationMode)
        {
            window->wl.visible = GLFW_TRUE;
            _glfwInputWindowDamage(window);
        }
    }
}